

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

ostream * operator<<(ostream *out,LUPMatrix *lup_matrix)

{
  string local_30;
  
  if (Options::output_type == 1) {
    LUPMatrix::ToLaTex_abi_cxx11_(&local_30,lup_matrix);
    std::operator<<(out,(string *)&local_30);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    LUPMatrix::ToString_abi_cxx11_(&local_30,lup_matrix);
    std::operator<<(out,(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LUPMatrix& lup_matrix) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << lup_matrix.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << lup_matrix.ToLaTex();
  }

  return out;
}